

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.h
# Opt level: O1

void __thiscall
Js::StringBuilder<Memory::ArenaAllocator>::EnsureBuffer
          (StringBuilder<Memory::ArenaAllocator> *this,charcount_t countNeeded)

{
  if ((countNeeded != 0) && (this->length - this->count <= countNeeded)) {
    if (countNeeded < 0x7fffffff) {
      ExtendBuffer(this,countNeeded + this->count + 1);
      return;
    }
    Throw::OutOfMemory();
  }
  return;
}

Assistant:

void EnsureBuffer(charcount_t countNeeded)
        {
            if(countNeeded == 0) return;

            if (countNeeded >= this->length - this->count)
            {
                if (countNeeded > MaxLength)
                {
                    // Check upfront to prevent potential uint32 overflow caused by (this->count + countNeeded + 1).
                    Throw::OutOfMemory();
                }
                ExtendBuffer(this->count + countNeeded + 1);
            }
        }